

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall
github111116::ConsoleLogger::log<int,char[7]>(ConsoleLogger *this,int *args,char (*args_1) [7])

{
  if (0 < this->loglevel) {
    return;
  }
  std::mutex::lock(&this->mtx);
  std::operator<<(this->out,"    ");
  print<int,char[7]>(this,args,args_1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}